

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O1

void Dar2_LibBuildClear_rec(Dar_LibObj_t *pObj,int *pCounter)

{
  uint uVar1;
  Dar_Lib_t *pDVar2;
  
  for (; (pObj->field_0x4 & 8) == 0; pObj = pDVar2->pObjs + *(ushort *)&pObj->field_0x2) {
    uVar1 = *pCounter;
    *pCounter = uVar1 + 1;
    *pObj = (Dar_LibObj_t)((ulong)*pObj & 0xfffffffff | (ulong)uVar1 << 0x24);
    pDVar2 = s_DarLib;
    s_DarLib->pDatas[uVar1 & 0xfffffff].field_0.iGunc = -1;
    Dar2_LibBuildClear_rec(pDVar2->pObjs + *(ushort *)pObj,pCounter);
  }
  return;
}

Assistant:

void Dar2_LibBuildClear_rec( Dar_LibObj_t * pObj, int * pCounter )
{
    if ( pObj->fTerm )
        return;
    pObj->Num = (*pCounter)++;
    s_DarLib->pDatas[ pObj->Num ].iGunc = -1;
    Dar2_LibBuildClear_rec( Dar_LibObj(s_DarLib, pObj->Fan0), pCounter );
    Dar2_LibBuildClear_rec( Dar_LibObj(s_DarLib, pObj->Fan1), pCounter );
}